

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCutTrav.c
# Opt level: O0

void Ivy_NodeComputeVolume2(Ivy_Obj_t *pObj,int nNodeLimit,Vec_Ptr_t *vNodes,Vec_Ptr_t *vFront)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  void *pvVar3;
  void *pvVar4;
  int local_48;
  uint local_44;
  int i;
  int LevelMax;
  Ivy_Obj_t *pFanin;
  Ivy_Obj_t *pPivot;
  Ivy_Obj_t *pLeaf;
  Vec_Ptr_t *vFront_local;
  Vec_Ptr_t *vNodes_local;
  int nNodeLimit_local;
  Ivy_Obj_t *pObj_local;
  
  iVar1 = Ivy_ObjIsNode(pObj);
  if (iVar1 == 0) {
    __assert_fail("Ivy_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyCutTrav.c"
                  ,0x11a,"void Ivy_NodeComputeVolume2(Ivy_Obj_t *, int, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  Vec_PtrClear(vNodes);
  Vec_PtrClear(vFront);
  *(uint *)&pObj->field_0x8 = *(uint *)&pObj->field_0x8 & 0xffffffef | 0x10;
  Vec_PtrPush(vNodes,pObj);
  Vec_PtrPush(vFront,pObj);
  local_44 = *(uint *)&pObj->field_0x8 >> 0xb;
  do {
    pFanin = (Ivy_Obj_t *)0x0;
    local_48 = Vec_PtrSize(vFront);
    do {
      local_48 = local_48 + -1;
      pIVar2 = pFanin;
      if (local_48 < 0) break;
      pIVar2 = (Ivy_Obj_t *)Vec_PtrEntry(vFront,local_48);
    } while (*(uint *)&pIVar2->field_0x8 >> 0xb != local_44);
    pFanin = pIVar2;
    if (pFanin == (Ivy_Obj_t *)0x0) {
      local_44 = local_44 - 1;
      if (local_44 == 0) break;
    }
    else {
      Vec_PtrRemove(vFront,pFanin);
      pIVar2 = Ivy_ObjFanin0(pFanin);
      if ((*(uint *)&pIVar2->field_0x8 >> 4 & 1) == 0) {
        *(uint *)&pIVar2->field_0x8 = *(uint *)&pIVar2->field_0x8 & 0xffffffef | 0x10;
        Vec_PtrPush(vNodes,pIVar2);
        Vec_PtrPush(vFront,pIVar2);
      }
      pIVar2 = Ivy_ObjFanin1(pFanin);
      if ((pIVar2 != (Ivy_Obj_t *)0x0) && ((*(uint *)&pIVar2->field_0x8 >> 4 & 1) == 0)) {
        *(uint *)&pIVar2->field_0x8 = *(uint *)&pIVar2->field_0x8 & 0xffffffef | 0x10;
        Vec_PtrPush(vNodes,pIVar2);
        Vec_PtrPush(vFront,pIVar2);
      }
    }
    iVar1 = Vec_PtrSize(vNodes);
  } while (iVar1 < nNodeLimit);
  Vec_PtrSort(vNodes,Ivy_CompareNodesByLevel);
  pvVar3 = Vec_PtrEntry(vNodes,0);
  pvVar4 = Vec_PtrEntryLast(vNodes);
  if (*(uint *)((long)pvVar3 + 8) >> 0xb <= *(uint *)((long)pvVar4 + 8) >> 0xb) {
    for (local_48 = 0; iVar1 = Vec_PtrSize(vNodes), local_48 < iVar1; local_48 = local_48 + 1) {
      pvVar3 = Vec_PtrEntry(vNodes,local_48);
      *(uint *)((long)pvVar3 + 8) = *(uint *)((long)pvVar3 + 8) & 0xffffffef;
      *(int *)((long)pvVar3 + 4) = local_48;
    }
    return;
  }
  __assert_fail("pFanin->Level <= pPivot->Level",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyCutTrav.c"
                ,0x150,"void Ivy_NodeComputeVolume2(Ivy_Obj_t *, int, Vec_Ptr_t *, Vec_Ptr_t *)");
}

Assistant:

void Ivy_NodeComputeVolume2( Ivy_Obj_t * pObj, int nNodeLimit, Vec_Ptr_t * vNodes, Vec_Ptr_t * vFront )
{
    Ivy_Obj_t * pLeaf, * pPivot, * pFanin;
    int LevelMax, i;
    assert( Ivy_ObjIsNode(pObj) );
    // clear arrays
    Vec_PtrClear( vNodes );
    Vec_PtrClear( vFront );
    // add the root
    pObj->fMarkA = 1;
    Vec_PtrPush( vNodes, pObj );
    Vec_PtrPush( vFront, pObj );
    // expand node with maximum level
    LevelMax = pObj->Level;
    do {
        // get the node to expand
        pPivot = NULL;
        Vec_PtrForEachEntryReverse( Ivy_Obj_t *, vFront, pLeaf, i )
        {
            if ( (int)pLeaf->Level == LevelMax )
            {
                pPivot = pLeaf;
                break;
            }
        }
        // decrease level if we did not find the node
        if ( pPivot == NULL )
        {
            if ( --LevelMax == 0 )
                break;
            continue;
        }
        // the node to expand is found
        // remove it from frontier
        Vec_PtrRemove( vFront, pPivot );
        // add fanins
        pFanin = Ivy_ObjFanin0(pPivot); 
        if ( !pFanin->fMarkA )
        {
            pFanin->fMarkA = 1;
            Vec_PtrPush( vNodes, pFanin );
            Vec_PtrPush( vFront, pFanin );
        }
        pFanin = Ivy_ObjFanin1(pPivot); 
        if ( pFanin && !pFanin->fMarkA )
        {
            pFanin->fMarkA = 1;
            Vec_PtrPush( vNodes, pFanin );
            Vec_PtrPush( vFront, pFanin );
        }
        // quit if we collected enough nodes
    } while ( Vec_PtrSize(vNodes) < nNodeLimit );

    // sort nodes by level
    Vec_PtrSort( vNodes, (int (*)(void))Ivy_CompareNodesByLevel );
    // make sure the nodes are ordered in the increasing number of levels
    pFanin = (Ivy_Obj_t *)Vec_PtrEntry( vNodes, 0 );
    pPivot = (Ivy_Obj_t *)Vec_PtrEntryLast( vNodes );
    assert( pFanin->Level <= pPivot->Level );

    // clean the marks and remember node numbers in the TravId
    Vec_PtrForEachEntry( Ivy_Obj_t *, vNodes, pFanin, i )
    {
        pFanin->fMarkA = 0;
        pFanin->TravId = i;
    }
}